

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O1

int __thiscall
sliding_puzzle::SlidingPuzzle::calculateLinearConflict
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *state)

{
  undefined1 *puVar1;
  element_type *peVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  SlidingPuzzle *pSVar8;
  long *plVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  SlidingPuzzleStatePtr *pSVar14;
  undefined1 *local_60;
  long *local_58;
  
  peVar2 = (state->
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  plVar3 = (long *)(peVar2->state_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(peVar2->state_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)plVar3;
  if (lVar6 == 0) {
    iVar7 = 0;
  }
  else {
    puVar11 = (undefined1 *)((lVar6 >> 3) * -0x5555555555555555);
    pSVar14 = (SlidingPuzzleStatePtr *)0x0;
    local_60 = (undefined1 *)0x1;
    iVar7 = 0;
    local_58 = plVar3;
    do {
      local_58 = local_58 + 3;
      lVar6 = plVar3[(long)pSVar14 * 3];
      if (plVar3[(long)pSVar14 * 3 + 1] - lVar6 != 0) {
        puVar13 = (undefined1 *)(plVar3[(long)pSVar14 * 3 + 1] - lVar6 >> 2);
        puVar1 = (undefined1 *)
                 ((long)&(pSVar14->
                         super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + 1);
        puVar10 = (undefined1 *)0x1;
        pSVar8 = (SlidingPuzzle *)0x0;
        do {
          iVar5 = *(int *)(lVar6 + (long)pSVar8 * 4);
          if (iVar5 == 0) {
LAB_00108b25:
            if (puVar1 <= puVar11 && (long)puVar11 - (long)puVar1 != 0) {
              plVar9 = local_58;
              puVar12 = local_60;
              do {
                if (pSVar8 == (SlidingPuzzle *)((ulong)this & 0xffffffff)) {
                  iVar5 = *(int *)(*plVar9 + (long)pSVar8 * 4) + -1;
                  iVar7 = iVar7 + (uint)(iVar5 / puzzle_size < (int)state &&
                                        pSVar8 == (SlidingPuzzle *)
                                                  ((long)iVar5 % (long)puzzle_size & 0xffffffffU));
                }
                puVar12 = puVar12 + 1;
                plVar9 = plVar9 + 3;
              } while (puVar12 <= puVar11 && (long)puVar11 - (long)puVar12 != 0);
            }
            if ((undefined1 *)((long)&(pSVar8->explored_)._M_h._M_buckets + 1U) < puVar13) {
              puVar12 = puVar10;
              do {
                if (pSVar14 == (SlidingPuzzleStatePtr *)((ulong)state & 0xffffffff)) {
                  iVar5 = *(int *)(lVar6 + (long)puVar12 * 4) + -1;
                  iVar7 = iVar7 + (uint)(iVar5 % puzzle_size < (int)this &&
                                        pSVar14 ==
                                        (SlidingPuzzleStatePtr *)
                                        ((long)iVar5 / (long)puzzle_size & 0xffffffffU));
                }
                puVar12 = puVar12 + 1;
              } while (puVar12 < puVar13);
            }
          }
          else {
            lVar4 = (long)(iVar5 + -1);
            this = (SlidingPuzzle *)(lVar4 % (long)puzzle_size & 0xffffffff);
            state = (SlidingPuzzleStatePtr *)(lVar4 / (long)puzzle_size & 0xffffffff);
            if (this != pSVar8 || state != pSVar14) goto LAB_00108b25;
          }
          pSVar8 = (SlidingPuzzle *)((long)&(pSVar8->explored_)._M_h._M_buckets + 1);
          puVar10 = puVar10 + 1;
        } while (pSVar8 != (SlidingPuzzle *)(puVar13 + (puVar13 == (undefined1 *)0x0)));
      }
      pSVar14 = (SlidingPuzzleStatePtr *)
                ((long)&(pSVar14->
                        super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + 1);
      local_60 = local_60 + 1;
    } while (pSVar14 != (SlidingPuzzleStatePtr *)(puVar11 + (puVar11 == (undefined1 *)0x0)));
  }
  return iVar7;
}

Assistant:

int SlidingPuzzle::calculateLinearConflict(const SlidingPuzzleStatePtr& state)
{
  int linear_conflict = 0;

  int target_location_a[2];
  int target_location_b[2];
  for (int i=0; i<state->state_.size(); ++i)
  {
    for (int j=0; j<state->state_[i].size(); ++j)
    {

      if (state->state_[i][j] != 0)
      {
        target_location_a[0] = (state->state_[i][j]-1)/puzzle_size;
        target_location_a[1] = (state->state_[i][j]-1)%puzzle_size;

        if (i == target_location_a[0] &&
            j == target_location_a[1])
        {
          continue;
        }
      }

      for (int k=i+1; k<state->state_.size(); ++k)
      {
        target_location_b[0] = (state->state_[k][j]-1)/puzzle_size;
        target_location_b[1] = (state->state_[k][j]-1)%puzzle_size;

        if ((target_location_a[1] == j) &&
            (target_location_b[1] == j))
        {
          if (target_location_a[0] > target_location_b[0])
          {
            linear_conflict += 1;
          }
        }
      }

      for (int k=j+1; k<state->state_[i].size(); ++k)
      {
        target_location_b[0] = (state->state_[i][k]-1)/puzzle_size;
        target_location_b[1] = (state->state_[i][k]-1)%puzzle_size;

        if ((target_location_a[0] == i) &&
            (target_location_b[0] == i))
        {
          if (target_location_a[1] > target_location_b[1])
          {
            linear_conflict += 1;
          }
        }
      }

    }
  }
  return linear_conflict;

}